

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

AttVal * ParseAttrs(TidyDocImpl *doc,Bool *isempty)

{
  tmbchar tVar1;
  Bool BVar2;
  tmbstr name;
  Attribute *pAVar3;
  int local_5c;
  tmbstr attribute;
  Node *php;
  Node *asp;
  tmbstr ptStack_38;
  int delim;
  tmbstr value;
  AttVal *list;
  AttVal *av;
  Lexer *lexer;
  Bool *isempty_local;
  TidyDocImpl *doc_local;
  
  av = (AttVal *)doc->lexer;
  value = (tmbstr)0x0;
  lexer = (Lexer *)isempty;
  isempty_local = (Bool *)doc;
  while( true ) {
    while( true ) {
      while( true ) {
        BVar2 = EndOfInput((TidyDocImpl *)isempty_local);
        if (BVar2 != no) {
          return (AttVal *)value;
        }
        name = ParseAttribute((TidyDocImpl *)isempty_local,&lexer->lines,&php,(Node **)&attribute);
        if (name == (tmbstr)0x0) break;
        ptStack_38 = ParseValue((TidyDocImpl *)isempty_local,name,no,&lexer->lines,
                                (int *)((long)&asp + 4));
        if ((name == (tmbstr)0x0) ||
           ((BVar2 = IsValidAttrName(name), BVar2 == no &&
            (((int)*(undefined8 *)(isempty_local + 0xec) == 0 ||
             (BVar2 = prvTidyIsValidXMLID(name), BVar2 == no)))))) {
          list = prvTidyNewAttribute((TidyDocImpl *)isempty_local);
          list->attribute = name;
          list->value = ptStack_38;
          tVar1 = LastChar(name);
          if (tVar1 == '\"') {
            prvTidyReportAttrError((TidyDocImpl *)isempty_local,(Node *)av[1].dict,list,0x25d);
          }
          else if (ptStack_38 == (tmbstr)0x0) {
            prvTidyReportAttrError((TidyDocImpl *)isempty_local,(Node *)av[1].dict,list,0x256);
          }
          else {
            prvTidyReportAttrError((TidyDocImpl *)isempty_local,(Node *)av[1].dict,list,0x248);
          }
          prvTidyFreeAttribute((TidyDocImpl *)isempty_local,list);
        }
        else {
          list = prvTidyNewAttribute((TidyDocImpl *)isempty_local);
          if (asp._4_4_ == 0) {
            local_5c = 0x22;
          }
          else {
            local_5c = asp._4_4_;
          }
          list->delim = local_5c;
          list->attribute = name;
          list->value = ptStack_38;
          pAVar3 = prvTidyFindAttribute((TidyDocImpl *)isempty_local,list);
          list->dict = pAVar3;
          AddAttrToList((AttVal **)&value,list);
          if ((asp._4_4_ == 0) && (ptStack_38 != (tmbstr)0x0)) {
            prvTidyReportAttrError((TidyDocImpl *)isempty_local,(Node *)av[1].dict,list,0x25e);
          }
        }
      }
      if (php == (Node *)0x0) break;
      list = prvTidyNewAttribute((TidyDocImpl *)isempty_local);
      list->asp = php;
      AddAttrToList((AttVal **)&value,list);
    }
    if (attribute == (tmbstr)0x0) break;
    list = prvTidyNewAttribute((TidyDocImpl *)isempty_local);
    list->php = (Node *)attribute;
    AddAttrToList((AttVal **)&value,list);
  }
  return (AttVal *)value;
}

Assistant:

static AttVal* ParseAttrs( TidyDocImpl* doc, Bool *isempty )
{
    Lexer* lexer = doc->lexer;
    AttVal *av, *list;
    tmbstr value;
    int delim;
    Node *asp, *php;

    list = NULL;

    while ( !EndOfInput(doc) )
    {
        tmbstr attribute = ParseAttribute( doc, isempty, &asp, &php );

        if (attribute == NULL)
        {
            /* check if attributes are created by ASP markup */
            if (asp)
            {
                av = TY_(NewAttribute)(doc);
                av->asp = asp;
                AddAttrToList( &list, av ); 
                continue;
            }

            /* check if attributes are created by PHP markup */
            if (php)
            {
                av = TY_(NewAttribute)(doc);
                av->php = php;
                AddAttrToList( &list, av ); 
                continue;
            }

            break;
        }

        value = ParseValue( doc, attribute, no, isempty, &delim );

        if (attribute && (IsValidAttrName(attribute) ||
            (cfgBool(doc, TidyXmlTags) && IsValidXMLAttrName(attribute))))
        {
            av = TY_(NewAttribute)(doc);
            av->delim = delim ? delim : '"';
            av->attribute = attribute;
            av->value = value;
            av->dict = TY_(FindAttribute)( doc, av );
            AddAttrToList( &list, av );
            if ( !delim && value )
                TY_(ReportAttrError)( doc, lexer->token, av, MISSING_QUOTEMARK_OPEN);
        }
        else
        {
            av = TY_(NewAttribute)(doc);
            av->attribute = attribute;
            av->value = value;

            if (LastChar(attribute) == '"')
                TY_(ReportAttrError)( doc, lexer->token, av, MISSING_QUOTEMARK);
            else if (value == NULL)
                TY_(ReportAttrError)(doc, lexer->token, av, MISSING_ATTR_VALUE);
            else
                TY_(ReportAttrError)(doc, lexer->token, av, INVALID_ATTRIBUTE);

            TY_(FreeAttribute)( doc, av );
        }
    }

    return list;
}